

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setTimeRange(QDateTimeEdit *this,QTime min,QTime max)

{
  QDateTimeEditPrivate *this_00;
  ulong uVar1;
  undefined4 in_EDX;
  QDate in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  QDateTimeEditPrivate *in_stack_ffffffffffffffa0;
  QDateTimeEditPrivate *pQVar2;
  undefined4 in_stack_ffffffffffffffd0;
  QDateTimeEdit *in_stack_ffffffffffffffd8;
  QDateTime local_18 [8];
  undefined4 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_EDX;
  this_00 = d_func((QDateTimeEdit *)0x559792);
  uVar1 = QTime::isValid();
  if (((uVar1 & 1) != 0) && (uVar1 = QTime::isValid(), (uVar1 & 1) != 0)) {
    ::QVariant::toDate();
    QDateTimeEditPrivate::dateTimeValue
              (in_stack_ffffffffffffffa0,in_RDI,(QTime)(int)((ulong)this_00 >> 0x20));
    pQVar2 = this_00;
    ::QVariant::toDate();
    QDateTimeEditPrivate::dateTimeValue(this_00,in_RDI,(QTime)(int)((ulong)pQVar2 >> 0x20));
    setDateTimeRange(in_stack_ffffffffffffffd8,
                     (QDateTime *)CONCAT44(local_10,in_stack_ffffffffffffffd0),
                     (QDateTime *)in_RDI.jd);
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffd8);
    QDateTime::~QDateTime(local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setTimeRange(QTime min, QTime max)
{
    Q_D(QDateTimeEdit);
    if (min.isValid() && max.isValid()) {
        setDateTimeRange(d->dateTimeValue(d->minimum.toDate(), min),
                         d->dateTimeValue(d->maximum.toDate(), max));
    }
}